

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape.h
# Opt level: O0

int __thiscall
Gudhi::Persistence_representations::Persistence_landscape::abs(Persistence_landscape *this,int __x)

{
  double dVar1;
  pair<double,_double> p2;
  int iVar2;
  size_type sVar3;
  ostream *poVar4;
  void *pvVar5;
  reference pvVar6;
  double dVar7;
  reference pvVar8;
  reference pvVar9;
  undefined4 in_register_00000034;
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  *this_00;
  pair<double,_double> pVar10;
  pair<double,_int> pVar11;
  double local_110;
  value_type local_108;
  double local_f8;
  value_type local_f0;
  double local_e0;
  int local_d8;
  int local_cc;
  pair<double,_int> local_c8;
  pair<double,_double> local_b8;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  double local_80;
  double zero;
  size_t i;
  pair<int,_int> local_68;
  pair<double,_double> local_60;
  undefined1 local_50 [8];
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> lambda_n;
  ulong local_28;
  size_t level;
  Persistence_landscape *this_local;
  Persistence_landscape *result;
  
  this_00 = (vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
             *)CONCAT44(in_register_00000034,__x);
  Persistence_landscape(this);
  for (local_28 = 0;
      sVar3 = std::
              vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
              ::size(this_00), local_28 != sVar3; local_28 = local_28 + 1) {
    if ((AbsDbg & 1) != 0) {
      poVar4 = std::operator<<((ostream *)&std::clog,"level: ");
      pvVar5 = (void *)std::ostream::operator<<(poVar4,local_28);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    }
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::vector
              ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
               local_50);
    iVar2 = std::numeric_limits<int>::max();
    i._4_4_ = -iVar2;
    i._0_4_ = 0;
    local_68 = std::make_pair<int,int>((int *)((long)&i + 4),(int *)&i);
    std::pair<double,_double>::pair<int,_int,_true>(&local_60,&local_68);
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::push_back
              ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
               local_50,&local_60);
    zero = 4.94065645841247e-324;
    while( true ) {
      dVar1 = zero;
      pvVar6 = std::
               vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
               ::operator[](this_00,local_28);
      dVar7 = (double)std::
                      vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ::size(pvVar6);
      if (dVar1 == dVar7) break;
      if ((AbsDbg & 1) != 0) {
        poVar4 = std::operator<<((ostream *)&std::clog,"this->land[");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_28);
        poVar4 = std::operator<<(poVar4,"][");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(ulong)zero);
        poVar4 = std::operator<<(poVar4,"] : ");
        pvVar6 = std::
                 vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ::operator[](this_00,local_28);
        pvVar8 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[](pvVar6,(size_type)zero);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,pvVar8->first);
        poVar4 = std::operator<<(poVar4," ");
        pvVar6 = std::
                 vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ::operator[](this_00,local_28);
        pvVar8 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[](pvVar6,(size_type)zero);
        pvVar5 = (void *)std::ostream::operator<<(poVar4,pvVar8->second);
        std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
      }
      pvVar6 = std::
               vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
               ::operator[](this_00,local_28);
      pvVar8 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[](pvVar6,(long)zero - 1);
      dVar1 = pvVar8->second;
      pvVar6 = std::
               vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
               ::operator[](this_00,local_28);
      pvVar8 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[](pvVar6,(size_type)zero);
      if (0.0 <= dVar1 * pvVar8->second) {
        pvVar6 = std::
                 vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ::operator[](this_00,local_28);
        pvVar8 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[](pvVar6,(size_type)zero);
        pvVar6 = std::
                 vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ::operator[](this_00,local_28);
        pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[](pvVar6,(size_type)zero);
        local_110 = ABS(pvVar9->second);
        pVar10 = std::make_pair<double&,double>(&pvVar8->first,&local_110);
        local_108.first = pVar10.first;
        local_108.second = pVar10.second;
        std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
        push_back((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
                  local_50,&local_108);
        if ((AbsDbg & 1) != 0) {
          poVar4 = std::operator<<((ostream *)&std::clog,"Adding pair : (");
          pvVar6 = std::
                   vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                   ::operator[](this_00,local_28);
          pvVar8 = std::
                   vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                   operator[](pvVar6,(size_type)zero);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,pvVar8->first);
          poVar4 = std::operator<<(poVar4,",");
          pvVar6 = std::
                   vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                   ::operator[](this_00,local_28);
          pvVar8 = std::
                   vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                   operator[](pvVar6,(size_type)zero);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,ABS(pvVar8->second));
          poVar4 = std::operator<<(poVar4,") ");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          std::istream::ignore();
        }
      }
      else {
        pvVar6 = std::
                 vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ::operator[](this_00,local_28);
        pvVar8 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[](pvVar6,(long)zero - 1);
        local_98 = pvVar8->first;
        dStack_90 = pvVar8->second;
        pvVar6 = std::
                 vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ::operator[](this_00,local_28);
        pvVar8 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[](pvVar6,(size_type)zero);
        local_a8 = pvVar8->first;
        dStack_a0 = pvVar8->second;
        p2.first = pvVar8->first;
        p2.second = pvVar8->second;
        pVar10.second = dStack_90;
        pVar10.first = local_98;
        local_80 = find_zero_of_a_line_segment_between_those_two_points(pVar10,p2);
        local_cc = 0;
        pVar11 = std::make_pair<double&,int>(&local_80,&local_cc);
        local_e0 = pVar11.first;
        local_d8 = pVar11.second;
        local_c8.first = local_e0;
        local_c8.second = local_d8;
        std::pair<double,_double>::pair<double,_int,_true>(&local_b8,&local_c8);
        std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
        push_back((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
                  local_50,&local_b8);
        pvVar6 = std::
                 vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ::operator[](this_00,local_28);
        pvVar8 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[](pvVar6,(size_type)zero);
        pvVar6 = std::
                 vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ::operator[](this_00,local_28);
        pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[](pvVar6,(size_type)zero);
        local_f8 = ABS(pvVar9->second);
        pVar10 = std::make_pair<double&,double>(&pvVar8->first,&local_f8);
        local_f0.first = pVar10.first;
        local_f0.second = pVar10.second;
        std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
        push_back((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
                  local_50,&local_f0);
        if ((AbsDbg & 1) != 0) {
          poVar4 = std::operator<<((ostream *)&std::clog,"Adding pair : (");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_80);
          poVar4 = std::operator<<(poVar4,",0)");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          poVar4 = std::operator<<((ostream *)&std::clog,"In the same step adding pair : (");
          pvVar6 = std::
                   vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                   ::operator[](this_00,local_28);
          pvVar8 = std::
                   vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                   operator[](pvVar6,(size_type)zero);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,pvVar8->first);
          poVar4 = std::operator<<(poVar4,",");
          pvVar6 = std::
                   vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                   ::operator[](this_00,local_28);
          pvVar8 = std::
                   vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                   operator[](pvVar6,(size_type)zero);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,ABS(pvVar8->second));
          poVar4 = std::operator<<(poVar4,") ");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          std::istream::ignore();
        }
      }
      zero = (double)((long)zero + 1);
    }
    std::
    vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
    ::push_back(&this->land,(value_type *)local_50);
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::~vector
              ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
               local_50);
  }
  return (int)this;
}

Assistant:

Persistence_landscape Persistence_landscape::abs() {
  Persistence_landscape result;
  for (size_t level = 0; level != this->land.size(); ++level) {
    if (AbsDbg) {
      std::clog << "level: " << level << std::endl;
    }
    std::vector<std::pair<double, double> > lambda_n;
    lambda_n.push_back(std::make_pair(-std::numeric_limits<int>::max(), 0));
    for (size_t i = 1; i != this->land[level].size(); ++i) {
      if (AbsDbg) {
        std::clog << "this->land[" << level << "][" << i << "] : " << this->land[level][i].first << " "
                  << this->land[level][i].second << std::endl;
      }
      // if a line segment between this->land[level][i-1] and this->land[level][i] crosses the x-axis, then we have to
      // add one landscape point t o result
      if ((this->land[level][i - 1].second) * (this->land[level][i].second) < 0) {
        double zero =
            find_zero_of_a_line_segment_between_those_two_points(this->land[level][i - 1], this->land[level][i]);

        lambda_n.push_back(std::make_pair(zero, 0));
        lambda_n.push_back(std::make_pair(this->land[level][i].first, fabs(this->land[level][i].second)));
        if (AbsDbg) {
          std::clog << "Adding pair : (" << zero << ",0)" << std::endl;
          std::clog << "In the same step adding pair : (" << this->land[level][i].first << ","
                    << fabs(this->land[level][i].second) << ") " << std::endl;
          std::cin.ignore();
        }
      } else {
        lambda_n.push_back(std::make_pair(this->land[level][i].first, fabs(this->land[level][i].second)));
        if (AbsDbg) {
          std::clog << "Adding pair : (" << this->land[level][i].first << "," << fabs(this->land[level][i].second)
                    << ") " << std::endl;
          std::cin.ignore();
        }
      }
    }
    result.land.push_back(lambda_n);
  }
  return result;
}